

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O1

int luaB_xpcall(lua_State *L)

{
  int iVar1;
  
  iVar1 = lua_gettop(L);
  if (iVar1 < 2) {
    luaL_argerror(L,2,"value expected");
  }
  lua_pushvalue(L,1);
  lua_copy(L,2,1);
  lua_replace(L,2);
  iVar1 = lua_pcallk(L,iVar1 + -2,-1,1,0,pcallcont);
  iVar1 = finishpcall(L,(uint)(iVar1 == 0));
  return iVar1;
}

Assistant:

static int luaB_xpcall (lua_State *L) {
  int status;
  int n = lua_gettop(L);
  luaL_argcheck(L, n >= 2, 2, "value expected");
  lua_pushvalue(L, 1);  /* exchange function... */
  lua_copy(L, 2, 1);  /* ...and error handler */
  lua_replace(L, 2);
  status = lua_pcallk(L, n - 2, LUA_MULTRET, 1, 0, pcallcont);
  return finishpcall(L, (status == LUA_OK));
}